

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-utils.h
# Opt level: O0

double tour_eval(Instance *instance,Tour *tour)

{
  int iVar1;
  int32_t *piVar2;
  double dVar3;
  int32_t local_44;
  int32_t next_vertex;
  int32_t curr_vertex;
  double demands;
  double profit;
  double cost;
  int32_t succ;
  int32_t i;
  Tour *tour_local;
  Instance *instance_local;
  
  if (tour->num_comps == 1) {
    for (cost._4_4_ = 0; cost._4_4_ < tour->num_customers + 1; cost._4_4_ = cost._4_4_ + 1) {
      piVar2 = tsucc(tour,cost._4_4_);
      iVar1 = *piVar2;
      if ((-1 < iVar1) &&
         ((piVar2 = tcomp(tour,cost._4_4_), *piVar2 != 0 || (tour->num_customers + 1 <= iVar1)))) {
        return INFINITY;
      }
    }
    profit = 0.0;
    local_44 = 0;
    demands = *instance->profits + 0.0;
    _next_vertex = *instance->demands + 0.0;
    while( true ) {
      piVar2 = tsucc(tour,local_44);
      iVar1 = *piVar2;
      if (iVar1 == 0) break;
      if (iVar1 == local_44) {
        __assert_fail("next_vertex != curr_vertex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                      ,0x80,"double tour_eval(const Instance *, Tour *)");
      }
      dVar3 = cptp_dist(instance,local_44,iVar1);
      profit = dVar3 + profit;
      demands = instance->profits[iVar1] + demands;
      _next_vertex = instance->demands[iVar1] + _next_vertex;
      local_44 = iVar1;
    }
    dVar3 = cptp_dist(instance,local_44,0);
    if (_next_vertex < instance->vehicle_cap || _next_vertex == instance->vehicle_cap) {
      instance_local = (Instance *)((dVar3 + profit) - demands);
    }
    else {
      instance_local = (Instance *)0x7ff0000000000000;
    }
  }
  else {
    instance_local = (Instance *)0x7ff0000000000000;
  }
  return (double)instance_local;
}

Assistant:

static inline double tour_eval(const Instance *instance, Tour *tour) {
    if (tour->num_comps != 1) {
        return INFINITY;
    }

    for (int32_t i = 0; i < tour->num_customers + 1; i++) {
        int32_t succ = *tsucc(tour, i);
        if (succ >= 0) {
            if (*tcomp(tour, i) != 0 || succ >= tour->num_customers + 1) {
                return INFINITY;
            }
        }
    }

    double cost = 0.0;
    double profit = 0.0;
    double demands = 0.0;

    int32_t curr_vertex = 0;
    int32_t next_vertex = -1;

    profit += instance->profits[0];
    demands += instance->demands[0];

    while ((next_vertex = *tsucc(tour, curr_vertex)) != 0) {
        assert(next_vertex != curr_vertex);
        cost += cptp_dist(instance, curr_vertex, next_vertex);
        profit += instance->profits[next_vertex];
        demands += instance->demands[next_vertex];
        curr_vertex = next_vertex;
    }

    cost += cptp_dist(instance, curr_vertex, 0);

    if (demands > instance->vehicle_cap) {
        return INFINITY;
    } else {
        return cost - profit;
    }
}